

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplevm.cpp
# Opt level: O2

int32_t * Compile(string *src_code,size_t *rsz)

{
  int iVar1;
  char ch;
  pointer pcVar2;
  char ch_00;
  int32_t *program;
  invalid_argument *this;
  ulong uVar3;
  int i;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar8;
  int iVar9;
  size_t sz;
  size_t *local_38;
  int iVar7;
  
  uVar3 = src_code->_M_string_length;
  uVar4 = 0;
  local_38 = rsz;
  program = (int32_t *)operator_new__(-(ulong)((uVar3 & 0x6000000000000000) != 0) | uVar3 * 8);
  sz = 0;
  pcVar2 = (src_code->_M_dataplus)._M_p;
  ch_00 = 'A';
  iVar5 = 0;
  do {
    if (uVar3 == uVar4) {
      uVar3 = 0;
      while( true ) {
        iVar5 = (int)uVar3;
        if (sz >> 1 <= uVar3) {
          *local_38 = sz;
          return program;
        }
        if (program[(uint)(iVar5 * 2)] == 7) break;
LAB_0010147f:
        uVar3 = (ulong)(iVar5 + 1);
      }
      iVar8 = 1;
LAB_0010142f:
      do {
        iVar9 = (int)uVar3 * 2 + 1;
        do {
          iVar7 = (int)uVar3;
          uVar6 = iVar7 + 1;
          uVar3 = (ulong)uVar6;
          if (sz >> 1 <= (ulong)(long)(int)uVar6) {
            if (iVar8 != 0) {
              this = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(this,"Un-matched [");
              __cxa_throw(this,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            goto LAB_0010147f;
          }
          iVar1 = iVar9 + 1;
          iVar9 = iVar9 + 2;
          if (program[iVar1] == 8) {
            iVar8 = iVar8 + -1;
            if (iVar8 != 0) goto LAB_0010142f;
            program[(ulong)(uint)(iVar5 * 2) + 1] = iVar7 + 2;
            program[iVar9] = iVar5;
            goto LAB_0010147f;
          }
        } while (program[iVar1] != 7);
        iVar8 = iVar8 + 1;
      } while( true );
    }
    ch = pcVar2[uVar4];
    switch(ch) {
    case '+':
    case '-':
switchD_001013b5_caseD_2b:
      if (ch_00 == ch) {
        iVar5 = iVar5 + 1;
      }
      else {
        ConvertToBytecode(ch_00,iVar5,program,&sz);
        iVar5 = 1;
        ch_00 = ch;
      }
      break;
    case ',':
    case '.':
switchD_001013b5_caseD_2c:
      ConvertToBytecode(ch_00,iVar5,program,&sz);
      ConvertToBytecode(ch,0,program,&sz);
      iVar5 = 0;
      ch_00 = 'A';
      break;
    default:
      if (ch == '<') goto switchD_001013b5_caseD_2b;
      if ((ch == ']') || (ch == '[')) goto switchD_001013b5_caseD_2c;
      if (ch == '>') goto switchD_001013b5_caseD_2b;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int32_t* Compile(const std::string& src_code, size_t *rsz) {
    size_t max_sz = src_code.length() * 2;
    int32_t *program = new int32_t[max_sz];
    size_t sz = 0;

    // compile the source code into vm bytecode
    const char* data = src_code.data();
    const size_t len = src_code.length();
    char prevCh = 'A';
    int32_t count = 0;
    for (int i = 0; i < len; i++) {
        char ch = data[i];
        switch (ch)
        {
            case '+':;
            case '-':;
            case '>':;
            case '<':;
                if (prevCh == ch) {
                    count++;
                } else {
                    ConvertToBytecode(prevCh, count, program, &sz);
                    prevCh = ch;
                    count = 1;
                }
                break;

            case '.':;
            case ',':;
            case '[':;
            case ']':
                ConvertToBytecode(prevCh, count, program, &sz);
                ConvertToBytecode(ch, 0, program, &sz);
                prevCh = 'A';
                count = 0;
                break;
        }
    }

    // pass two - set jz/jmp destination address
    for (uint32_t addr = 0; addr < sz / 2; addr++) {
        int32_t op = program[addr * 2];
        if (op != JZ) {
            continue;
        }

        int nesting = 1;
        for (int32_t tmpaddr = addr + 1; tmpaddr < sz / 2; tmpaddr++) {
            int32_t tmpop = program[tmpaddr * 2];
            if (tmpop == JZ) {
                nesting++;
            }
            else if (tmpop == JMP) {
                nesting--;
                if (nesting == 0) {
                    program[addr * 2 + 1] = tmpaddr + 1;
                    program[tmpaddr * 2 + 1] = addr;
                    break;
                }
            }
        }
        if (nesting != 0) {
            throw std::invalid_argument("Un-matched [");
        }
    }

    *rsz = sz;
    return program;
}